

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MppBufferImpl * mpp_buffer_get_unused(MppBufferGroupImpl *p,size_t size,char *caller)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  list_head *plVar4;
  list_head *plVar5;
  list_head *plVar6;
  MppBufferImpl *buffer;
  int iVar7;
  
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_get_unused");
  }
  pthread_mutex_lock((pthread_mutex_t *)&p->buf_lock);
  plVar6 = (p->list_unused).next;
  if (plVar6 == &p->list_unused) {
    buffer = (MppBufferImpl *)0x0;
  }
  else {
    iVar7 = 0;
    do {
      plVar4 = plVar6->next;
      if ((mpp_buffer_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"mpp_buffer","request size %d on buf idx %d size %d\n",(char *)0x0,size,
                   (ulong)*(uint *)((long)&plVar6[-6].next + 4),plVar6[-4].next);
      }
      buffer = (MppBufferImpl *)&plVar6[-0xd].prev;
      if (size <= plVar6[-4].next) {
        pthread_mutex_lock((pthread_mutex_t *)(plVar6 + -10));
        piVar1 = (int *)((long)&plVar6[-1].prev + 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)&plVar6[-1].prev = 1;
        buf_add_log(buffer,BUF_REF_INC,caller);
        plVar4 = plVar6->next;
        plVar5 = plVar6->prev;
        plVar4->prev = plVar5;
        plVar5->next = plVar4;
        plVar6->prev = plVar6;
        plVar4 = (p->list_used).prev;
        (p->list_used).prev = plVar6;
        plVar6->next = &p->list_used;
        plVar6->prev = plVar4;
        plVar4->next = plVar6;
        uVar2 = p->count_used;
        uVar3 = p->count_unused;
        p->count_used = uVar2 + 1;
        p->count_unused = uVar3 + -1;
        pthread_mutex_unlock((pthread_mutex_t *)(plVar6 + -10));
        goto LAB_00131e09;
      }
      if (p->mode == MPP_BUFFER_INTERNAL) {
        put_buffer(p,buffer,0,caller);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      plVar6 = plVar4;
    } while (plVar4 != &p->list_unused);
    if (iVar7 == 0) {
      buffer = (MppBufferImpl *)0x0;
    }
    else {
      buffer = (MppBufferImpl *)0x0;
      _mpp_log_l(2,"mpp_buffer","can not found match buffer with size larger than %d\n",
                 "mpp_buffer_get_unused",size);
      mpp_buffer_group_dump(p,caller);
    }
  }
LAB_00131e09:
  pthread_mutex_unlock((pthread_mutex_t *)&p->buf_lock);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_get_unused");
  }
  return buffer;
}

Assistant:

MppBufferImpl *mpp_buffer_get_unused(MppBufferGroupImpl *p, size_t size, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MppBufferImpl *buffer = NULL;

    pthread_mutex_lock(&p->buf_lock);
    if (!list_empty(&p->list_unused)) {
        MppBufferImpl *pos, *n;
        RK_S32 found = 0;
        RK_S32 search_count = 0;

        list_for_each_entry_safe(pos, n, &p->list_unused, MppBufferImpl, list_status) {
            mpp_buf_dbg(MPP_BUF_DBG_CHECK_SIZE, "request size %d on buf idx %d size %d\n",
                        size, pos->buffer_id, pos->info.size);
            if (pos->info.size >= size) {
                buffer = pos;
                pthread_mutex_lock(&buffer->lock);
                buffer->ref_count++;
                buffer->used = 1;
                buf_add_log(buffer, BUF_REF_INC, caller);
                list_del_init(&buffer->list_status);
                list_add_tail(&buffer->list_status, &p->list_used);
                p->count_used++;
                p->count_unused--;
                pthread_mutex_unlock(&buffer->lock);
                found = 1;
                break;
            } else {
                if (MPP_BUFFER_INTERNAL == p->mode) {
                    put_buffer(p, pos, 0, caller);
                } else
                    search_count++;
            }
        }

        if (!found && search_count) {
            mpp_err_f("can not found match buffer with size larger than %d\n", size);
            mpp_buffer_group_dump(p, caller);
        }
    }
    pthread_mutex_unlock(&p->buf_lock);

    MPP_BUF_FUNCTION_LEAVE();
    return buffer;
}